

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_strmatch_fuzzy_text(char *str,int str_len,char *pattern,int *out_score)

{
  char cVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  char *pcVar12;
  int iVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  
  if (str == (char *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x19b9,"int nk_strmatch_fuzzy_text(const char *, int, const char *, int *)");
  }
  if (pattern == (char *)0x0) {
    __assert_fail("pattern",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x19ba,"int nk_strmatch_fuzzy_text(const char *, int, const char *, int *)");
  }
  iVar4 = 0;
  if (str_len != 0) {
    if (str_len < 1) {
      iVar8 = 0;
    }
    else {
      bVar18 = true;
      lVar11 = 0;
      iVar8 = 0;
      bVar3 = 0;
      bVar14 = false;
      uVar6 = 0;
      pcVar5 = (char *)0x0;
      pcVar12 = pattern;
      do {
        iVar4 = (int)*pcVar12;
        cVar1 = *str;
        iVar13 = (int)cVar1;
        if (iVar4 == 0) {
          bVar15 = false;
        }
        else {
          iVar2 = iVar4 + -0xa2;
          if (0x19 < iVar4 - 0x41U) {
            iVar2 = iVar4;
          }
          iVar9 = iVar13 + -0xa2;
          if (0x19 < iVar13 - 0x41U) {
            iVar9 = iVar13;
          }
          bVar15 = iVar2 == iVar9;
        }
        if (pcVar5 == (char *)0x0) {
          bVar16 = false;
        }
        else {
          iVar9 = (int)*pcVar5;
          iVar2 = iVar9 + -0x20;
          if (0x19 < iVar9 - 0x61U) {
            iVar2 = iVar9;
          }
          iVar9 = iVar13 + -0x20;
          if (0x19 < iVar13 - 0x61U) {
            iVar9 = iVar13;
          }
          bVar16 = iVar2 == iVar9;
        }
        bVar17 = false;
        if ((pcVar5 != (char *)0x0) && (*pcVar12 != '\0')) {
          iVar9 = (int)*pcVar5;
          iVar2 = iVar9 + -0xa2;
          if (0x19 < iVar9 - 0x41U) {
            iVar2 = iVar9;
          }
          iVar9 = iVar4 + -0xa2;
          if (0x19 < iVar4 - 0x41U) {
            iVar9 = iVar4;
          }
          bVar17 = iVar2 == iVar9;
        }
        if ((pcVar5 != (char *)0x0 & bVar15) != 0 || bVar17) {
          pcVar5 = (char *)0x0;
          uVar7 = uVar6;
          uVar6 = 0;
        }
        else {
          uVar7 = 0;
        }
        iVar8 = uVar7 + iVar8;
        if (bVar16 || bVar15 != false) {
          if (pcVar12 == pattern) {
            iVar4 = -9;
            if (-9 < (int)lVar11) {
              iVar4 = (int)lVar11;
            }
            iVar8 = iVar8 + iVar4;
          }
          uVar7 = (uint)bVar3 * 5 + 10;
          if (!bVar18) {
            uVar7 = (uint)bVar3 * 5;
          }
          uVar10 = uVar7 + 10;
          if (iVar13 - 0x5bU < 0xffffffe6) {
            uVar10 = uVar7;
          }
          if (!bVar14) {
            uVar10 = uVar7;
          }
          pcVar12 = pcVar12 + bVar15;
          bVar18 = pcVar5 != (char *)0x0;
          if (uVar6 <= uVar10) {
            pcVar5 = str;
          }
          bVar14 = uVar6 <= uVar10;
          if (uVar10 <= uVar6) {
            uVar10 = uVar6;
          }
          uVar6 = uVar10;
          iVar8 = iVar8 - (uint)(bVar14 && bVar18);
          bVar3 = 1;
        }
        else {
          iVar8 = iVar8 + -1;
          bVar3 = 0;
        }
        bVar14 = iVar13 - 0x61U < 0x1a;
        bVar18 = cVar1 == ' ' || cVar1 == '_';
        lVar11 = lVar11 + -3;
        str = str + 1;
      } while ((ulong)(uint)str_len * 3 + lVar11 != 0);
      if (pcVar5 == (char *)0x0) {
        uVar6 = 0;
      }
      iVar8 = iVar8 + uVar6;
      pattern = pcVar12;
    }
    iVar4 = 0;
    if ((*pattern == '\0') && (iVar4 = 1, out_score != (int *)0x0)) {
      *out_score = iVar8;
    }
  }
  return iVar4;
}

Assistant:

NK_API int
nk_strmatch_fuzzy_text(const char *str, int str_len,
    const char *pattern, int *out_score)
{
    /* Returns true if each character in pattern is found sequentially within str
     * if found then out_score is also set. Score value has no intrinsic meaning.
     * Range varies with pattern. Can only compare scores with same search pattern. */

    /* bonus for adjacent matches */
    #define NK_ADJACENCY_BONUS 5
    /* bonus if match occurs after a separator */
    #define NK_SEPARATOR_BONUS 10
    /* bonus if match is uppercase and prev is lower */
    #define NK_CAMEL_BONUS 10
    /* penalty applied for every letter in str before the first match */
    #define NK_LEADING_LETTER_PENALTY (-3)
    /* maximum penalty for leading letters */
    #define NK_MAX_LEADING_LETTER_PENALTY (-9)
    /* penalty for every letter that doesn't matter */
    #define NK_UNMATCHED_LETTER_PENALTY (-1)

    /* loop variables */
    int score = 0;
    char const * pattern_iter = pattern;
    int str_iter = 0;
    int prev_matched = nk_false;
    int prev_lower = nk_false;
    /* true so if first letter match gets separator bonus*/
    int prev_separator = nk_true;

    /* use "best" matched letter if multiple string letters match the pattern */
    char const * best_letter = 0;
    int best_letter_score = 0;

    /* loop over strings */
    NK_ASSERT(str);
    NK_ASSERT(pattern);
    if (!str || !str_len || !pattern) return 0;
    while (str_iter < str_len)
    {
        const char pattern_letter = *pattern_iter;
        const char str_letter = str[str_iter];

        int next_match = *pattern_iter != '\0' &&
            nk_to_lower(pattern_letter) == nk_to_lower(str_letter);
        int rematch = best_letter && nk_to_upper(*best_letter) == nk_to_upper(str_letter);

        int advanced = next_match && best_letter;
        int pattern_repeat = best_letter && *pattern_iter != '\0';
        pattern_repeat = pattern_repeat &&
            nk_to_lower(*best_letter) == nk_to_lower(pattern_letter);

        if (advanced || pattern_repeat) {
            score += best_letter_score;
            best_letter = 0;
            best_letter_score = 0;
        }

        if (next_match || rematch)
        {
            int new_score = 0;
            /* Apply penalty for each letter before the first pattern match */
            if (pattern_iter == pattern) {
                int count = (int)(&str[str_iter] - str);
                int penalty = NK_LEADING_LETTER_PENALTY * count;
                if (penalty < NK_MAX_LEADING_LETTER_PENALTY)
                    penalty = NK_MAX_LEADING_LETTER_PENALTY;

                score += penalty;
            }

            /* apply bonus for consecutive bonuses */
            if (prev_matched)
                new_score += NK_ADJACENCY_BONUS;

            /* apply bonus for matches after a separator */
            if (prev_separator)
                new_score += NK_SEPARATOR_BONUS;

            /* apply bonus across camel case boundaries */
            if (prev_lower && nk_is_upper(str_letter))
                new_score += NK_CAMEL_BONUS;

            /* update pattern iter IFF the next pattern letter was matched */
            if (next_match)
                ++pattern_iter;

            /* update best letter in str which may be for a "next" letter or a rematch */
            if (new_score >= best_letter_score) {
                /* apply penalty for now skipped letter */
                if (best_letter != 0)
                    score += NK_UNMATCHED_LETTER_PENALTY;

                best_letter = &str[str_iter];
                best_letter_score = new_score;
            }
            prev_matched = nk_true;
        } else {
            score += NK_UNMATCHED_LETTER_PENALTY;
            prev_matched = nk_false;
        }

        /* separators should be more easily defined */
        prev_lower = nk_is_lower(str_letter) != 0;
        prev_separator = str_letter == '_' || str_letter == ' ';

        ++str_iter;
    }

    /* apply score for last match */
    if (best_letter)
        score += best_letter_score;

    /* did not match full pattern */
    if (*pattern_iter != '\0')
        return nk_false;

    if (out_score)
        *out_score = score;
    return nk_true;
}